

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# param-utils.cpp
# Opt level: O0

SortedVector *
wasm::ParamUtils::applyConstantValues
          (SortedVector *__return_storage_ptr__,
          vector<wasm::Function_*,_std::allocator<wasm::Function_*>_> *funcs,
          vector<wasm::Call_*,_std::allocator<wasm::Call_*>_> *calls,
          vector<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_> *callRefs,Module *module)

{
  Function *pFVar1;
  undefined4 index;
  bool bVar2;
  size_type sVar3;
  const_reference ppFVar4;
  size_t sVar5;
  reference ppCVar6;
  reference ppCVar7;
  Expression **ppEVar8;
  reference ppFVar9;
  Expression *value_00;
  LocalSet *left;
  Block *pBVar10;
  Function *func_1;
  const_iterator __end3_2;
  const_iterator __begin3_2;
  vector<wasm::Function_*,_std::allocator<wasm::Function_*>_> *__range3_2;
  Builder builder;
  CallRef *call_1;
  const_iterator __end3_1;
  const_iterator __begin3_1;
  vector<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_> *__range3_1;
  Call *call;
  const_iterator __end3;
  const_iterator __begin3;
  vector<wasm::Call_*,_std::allocator<wasm::Call_*>_> *__range3;
  PossibleConstantValues value;
  Index i;
  size_t numParams;
  Function *func;
  const_iterator __end2;
  const_iterator __begin2;
  vector<wasm::Function_*,_std::allocator<wasm::Function_*>_> *__range2;
  Function *first;
  Module *module_local;
  vector<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_> *callRefs_local;
  vector<wasm::Call_*,_std::allocator<wasm::Call_*>_> *calls_local;
  vector<wasm::Function_*,_std::allocator<wasm::Function_*>_> *funcs_local;
  SortedVector *optimized;
  
  sVar3 = std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>::size(funcs);
  if (sVar3 == 0) {
    __assert_fail("funcs.size() > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/param-utils.cpp"
                  ,0xd0,
                  "SortedVector wasm::ParamUtils::applyConstantValues(const std::vector<Function *> &, const std::vector<Call *> &, const std::vector<CallRef *> &, Module *)"
                 );
  }
  ppFVar4 = std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>::operator[](funcs,0);
  pFVar1 = *ppFVar4;
  __end2 = std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>::begin(funcs);
  func = (Function *)std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>::end(funcs);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<wasm::Function_*const_*,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>
                                     *)&func), bVar2) {
    ppFVar9 = __gnu_cxx::
              __normal_iterator<wasm::Function_*const_*,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>
              ::operator*(&__end2);
    bVar2 = HeapType::operator==(&(*ppFVar9)->type,&pFVar1->type);
    if (!bVar2) {
      __assert_fail("func->type == first->type",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/param-utils.cpp"
                    ,0xd4,
                    "SortedVector wasm::ParamUtils::applyConstantValues(const std::vector<Function *> &, const std::vector<Call *> &, const std::vector<CallRef *> &, Module *)"
                   );
    }
    __gnu_cxx::
    __normal_iterator<wasm::Function_*const_*,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>
    ::operator++(&__end2);
  }
  SortedVector::SortedVector(__return_storage_ptr__);
  sVar5 = Function::getNumParams(pFVar1);
  value.value.
  super__Variant_base<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
  .
  super__Move_assign_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
  .
  super__Copy_assign_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
  .
  super__Move_ctor_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
  .
  super__Copy_ctor_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
  .
  super__Variant_storage_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
  ._M_index = '\0';
  value.value.
  super__Variant_base<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
  .
  super__Move_assign_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
  .
  super__Copy_assign_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
  .
  super__Move_ctor_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
  .
  super__Copy_ctor_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
  .
  super__Variant_storage_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
  ._25_3_ = 0;
  do {
    if (sVar5 <= (uint)value.value.
                       super__Variant_base<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
                       .
                       super__Move_assign_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
                       .
                       super__Copy_assign_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
                       .
                       super__Move_ctor_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
                       .
                       super__Copy_ctor_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
                       .
                       super__Variant_storage_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
                       ._24_4_) {
      return __return_storage_ptr__;
    }
    PossibleConstantValues::PossibleConstantValues((PossibleConstantValues *)&__range3);
    __end3 = std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>::begin(calls);
    call = (Call *)std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>::end(calls);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<wasm::Call_*const_*,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>
                                       *)&call), bVar2) {
      ppCVar6 = __gnu_cxx::
                __normal_iterator<wasm::Call_*const_*,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>
                ::operator*(&__end3);
      ppEVar8 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&((*ppCVar6)->operands).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,(ulong)(uint)value.value.
                                         super__Variant_base<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
                                         .
                                         super__Move_assign_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
                                         .
                                         super__Copy_assign_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
                                         .
                                         super__Move_ctor_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
                                         .
                                         super__Copy_ctor_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
                                         .
                                         super__Variant_storage_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
                                         ._24_4_);
      PossibleConstantValues::note((PossibleConstantValues *)&__range3,*ppEVar8,module);
      bVar2 = PossibleConstantValues::isConstant((PossibleConstantValues *)&__range3);
      if (!bVar2) break;
      __gnu_cxx::
      __normal_iterator<wasm::Call_*const_*,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>
      ::operator++(&__end3);
    }
    __end3_1 = std::vector<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_>::begin(callRefs);
    call_1 = (CallRef *)
             std::vector<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_>::end(callRefs);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end3_1,
                              (__normal_iterator<wasm::CallRef_*const_*,_std::vector<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_>_>
                               *)&call_1), bVar2) {
      ppCVar7 = __gnu_cxx::
                __normal_iterator<wasm::CallRef_*const_*,_std::vector<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_>_>
                ::operator*(&__end3_1);
      ppEVar8 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&((*ppCVar7)->operands).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,(ulong)(uint)value.value.
                                         super__Variant_base<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
                                         .
                                         super__Move_assign_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
                                         .
                                         super__Copy_assign_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
                                         .
                                         super__Move_ctor_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
                                         .
                                         super__Copy_ctor_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
                                         .
                                         super__Variant_storage_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
                                         ._24_4_);
      PossibleConstantValues::note((PossibleConstantValues *)&__range3,*ppEVar8,module);
      bVar2 = PossibleConstantValues::isConstant((PossibleConstantValues *)&__range3);
      if (!bVar2) break;
      __gnu_cxx::
      __normal_iterator<wasm::CallRef_*const_*,_std::vector<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_>_>
      ::operator++(&__end3_1);
    }
    bVar2 = PossibleConstantValues::isConstant((PossibleConstantValues *)&__range3);
    if (bVar2) {
      Builder::Builder((Builder *)&__range3_2,module);
      __end3_2 = std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>::begin(funcs);
      func_1 = (Function *)
               std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>::end(funcs);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end3_2,
                                (__normal_iterator<wasm::Function_*const_*,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>
                                 *)&func_1), bVar2) {
        ppFVar9 = __gnu_cxx::
                  __normal_iterator<wasm::Function_*const_*,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>
                  ::operator*(&__end3_2);
        index = value.value.
                super__Variant_base<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
                .
                super__Move_assign_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
                .
                super__Copy_assign_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
                .
                super__Move_ctor_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
                .
                super__Copy_ctor_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
                .
                super__Variant_storage_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
                ._24_4_;
        pFVar1 = *ppFVar9;
        value_00 = PossibleConstantValues::makeExpression
                             ((PossibleConstantValues *)&__range3,module);
        left = Builder::makeLocalSet((Builder *)&__range3_2,index,value_00);
        pBVar10 = Builder::makeSequence((Builder *)&__range3_2,(Expression *)left,pFVar1->body);
        pFVar1->body = (Expression *)pBVar10;
        __gnu_cxx::
        __normal_iterator<wasm::Function_*const_*,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>
        ::operator++(&__end3_2);
      }
      SortedVector::insert
                (__return_storage_ptr__,
                 value.value.
                 super__Variant_base<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
                 .
                 super__Move_assign_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
                 .
                 super__Copy_assign_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
                 .
                 super__Move_ctor_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
                 .
                 super__Copy_ctor_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
                 .
                 super__Variant_storage_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
                 ._24_4_);
      builder.wasm._4_4_ = 0;
    }
    else {
      builder.wasm._4_4_ = 6;
    }
    PossibleConstantValues::~PossibleConstantValues((PossibleConstantValues *)&__range3);
    value.value.
    super__Variant_base<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
    .
    super__Move_assign_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
    .
    super__Copy_assign_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
    .
    super__Move_ctor_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
    .
    super__Copy_ctor_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
    .
    super__Variant_storage_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
    ._24_4_ = value.value.
              super__Variant_base<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
              .
              super__Move_assign_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
              .
              super__Copy_assign_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
              .
              super__Move_ctor_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
              .
              super__Copy_ctor_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
              .
              super__Variant_storage_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
              ._24_4_ + 1;
  } while( true );
}

Assistant:

SortedVector applyConstantValues(const std::vector<Function*>& funcs,
                                 const std::vector<Call*>& calls,
                                 const std::vector<CallRef*>& callRefs,
                                 Module* module) {
  assert(funcs.size() > 0);
  auto* first = funcs[0];
#ifndef NDEBUG
  for (auto* func : funcs) {
    assert(func->type == first->type);
  }
#endif

  SortedVector optimized;
  auto numParams = first->getNumParams();
  for (Index i = 0; i < numParams; i++) {
    PossibleConstantValues value;
    for (auto* call : calls) {
      value.note(call->operands[i], *module);
      if (!value.isConstant()) {
        break;
      }
    }
    for (auto* call : callRefs) {
      value.note(call->operands[i], *module);
      if (!value.isConstant()) {
        break;
      }
    }
    if (!value.isConstant()) {
      continue;
    }

    // Optimize: write the constant value in the function bodies, making them
    // ignore the parameter's value.
    Builder builder(*module);
    for (auto* func : funcs) {
      func->body = builder.makeSequence(
        builder.makeLocalSet(i, value.makeExpression(*module)), func->body);
    }
    optimized.insert(i);
  }

  return optimized;
}